

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_unsafe_raw_value(void)

{
  return;
}

Assistant:

void test_unsafe_raw_value()
{
  typedef compact_optional< evp_int<int, -1> > opt_int;
  opt_int oi_, oiN1(-1), oi0(0), oi1(1);
  
  assert ( oi_.unsafe_raw_value() == -1);
  assert (oiN1.unsafe_raw_value() == -1);
  assert ( oi0.unsafe_raw_value() ==  0);
  assert ( oi1.unsafe_raw_value() ==  1);
}